

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O1

void do_smite(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  CHAR_DATA *ch_00;
  char *txt;
  char arg1 [4608];
  char local_1218 [4608];
  
  bVar1 = is_npc(ch);
  if (bVar1) {
    send_to_char("Mobs can\'t smite.\n\r",ch);
    return;
  }
  one_argument(argument,local_1218);
  if (local_1218[0] == '\0') {
    txt = "Syntax: smite <char>\n\r";
  }
  else {
    ch_00 = get_char_world(ch,local_1218);
    if (ch_00 == (CHAR_DATA *)0x0) {
      txt = "They aren\'t playing.\n\r";
    }
    else {
      bVar1 = is_npc(ch_00);
      if (bVar1) {
        txt = "Trying to smite a mob?\n\r";
      }
      else {
        if (ch_00 != ch) {
          act("A bolt from the heavens smites $N!",ch,(void *)0x0,ch_00,1);
          act("A bolt from the heavens smites you!",ch,(void *)0x0,ch_00,2);
          act("You smite $N!",ch,(void *)0x0,ch_00,3);
          ch_00->hit = ch_00->hit / 2;
          return;
        }
        txt = "Trying to smite yourself?\n\r";
      }
    }
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_smite(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *victim;
	char arg1[MAX_INPUT_LENGTH];

	if (is_npc(ch))
	{
		send_to_char("Mobs can't smite.\n\r", ch);
		return;
	}

	argument = one_argument(argument, arg1);

	if (arg1[0] == '\0')
	{
		send_to_char("Syntax: smite <char>\n\r", ch);
		return;
	}

	victim = get_char_world(ch, arg1);

	if (victim == nullptr)
	{
		send_to_char("They aren't playing.\n\r", ch);
		return;
	}

	if (is_npc(victim))
	{
		send_to_char("Trying to smite a mob?\n\r", ch);
		return;
	}

	if (ch == victim)
	{
		send_to_char("Trying to smite yourself?\n\r", ch);
		return;
	}

	act("A bolt from the heavens smites $N!", ch, nullptr, victim, TO_NOTVICT);
	act("A bolt from the heavens smites you!", ch, nullptr, victim, TO_VICT);
	act("You smite $N!", ch, nullptr, victim, TO_CHAR);

	victim->hit /= 2;
}